

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O3

void fs_read_bufs(int add_flags)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __off64_t _Var6;
  void *pvVar7;
  void *pvVar8;
  undefined8 extraout_RAX;
  char *pcVar9;
  undefined1 *unaff_RBX;
  uv_fs_t *puVar10;
  undefined1 *puVar11;
  long unaff_R12;
  ulong uVar12;
  uv_fs_t *unaff_R14;
  long lVar13;
  void *pvVar14;
  char *pcVar15;
  uv_buf_t uVar16;
  undefined1 auVar17 [16];
  char scratch [768];
  undefined1 auStack_452 [2];
  code *pcStack_450;
  undefined8 uStack_448;
  void *pvStack_440;
  long lStack_438;
  undefined1 auStack_3c8 [16];
  undefined1 auStack_3b8 [16];
  undefined8 uStack_3a0;
  uv_fs_t *puStack_398;
  uv_fs_t *puStack_390;
  undefined8 uStack_388;
  code *pcStack_378;
  code *pcStack_370;
  undefined8 local_368;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [256];
  undefined1 local_218 [256];
  undefined1 local_118 [128];
  undefined1 local_98 [136];
  
  iVar3 = 0;
  pcStack_370 = (code *)0x157bd3;
  iVar2 = uv_fs_open(0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,0);
  if (iVar2 < 0) {
    pcStack_370 = (code *)0x157e0b;
    fs_read_bufs_cold_1();
LAB_00157e0b:
    pcStack_370 = (code *)0x157e10;
    fs_read_bufs_cold_2();
LAB_00157e10:
    pcStack_370 = (code *)0x157e15;
    fs_read_bufs_cold_3();
LAB_00157e15:
    pcStack_370 = (code *)0x157e1a;
    fs_read_bufs_cold_4();
LAB_00157e1a:
    pcStack_370 = (code *)0x157e1f;
    fs_read_bufs_cold_5();
LAB_00157e1f:
    pcStack_370 = (code *)0x157e24;
    fs_read_bufs_cold_6();
LAB_00157e24:
    pcStack_370 = (code *)0x157e29;
    fs_read_bufs_cold_7();
LAB_00157e29:
    pcStack_370 = (code *)0x157e2e;
    fs_read_bufs_cold_8();
LAB_00157e2e:
    pcStack_370 = (code *)0x157e33;
    fs_read_bufs_cold_9();
LAB_00157e33:
    pcStack_370 = (code *)0x157e38;
    fs_read_bufs_cold_10();
LAB_00157e38:
    pcStack_370 = (code *)0x157e3d;
    fs_read_bufs_cold_11();
LAB_00157e3d:
    pcStack_370 = (code *)0x157e42;
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00157e0b;
    pcStack_370 = (code *)0x157bf5;
    uv_fs_req_cleanup();
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157c19;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,0,0);
    if (iVar2 != -0x16) goto LAB_00157e10;
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157c49;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,0,1,0);
    if (iVar2 != -0x16) goto LAB_00157e15;
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157c79;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,local_358,0,0);
    if (iVar2 != -0x16) goto LAB_00157e1a;
    pcStack_370 = (code *)0x157c91;
    local_358 = uv_buf_init(local_318,0x100);
    unaff_RBX = local_358;
    pcStack_370 = (code *)0x157caf;
    local_348 = uv_buf_init(local_218,0x100);
    pcStack_370 = (code *)0x157cc9;
    local_338 = uv_buf_init(local_118,0x80);
    pcStack_370 = (code *)0x157ce3;
    local_328 = uv_buf_init(local_98,0x80);
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157d13;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,unaff_RBX,2,0);
    if (iVar2 != 0x1be) goto LAB_00157e1f;
    if (read_req.result != 0x1be) goto LAB_00157e24;
    unaff_RBX = local_338;
    unaff_R14 = &read_req;
    pcStack_370 = (code *)0x157d43;
    uv_fs_req_cleanup();
    local_368 = 0;
    iVar3 = 0;
    pcStack_370 = (code *)0x157d6a;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,unaff_RBX,2,0x100);
    if (iVar2 != 0xbe) goto LAB_00157e29;
    if (read_req.result != 0xbe) goto LAB_00157e2e;
    pcStack_370 = (code *)0x157d92;
    uv_fs_req_cleanup(&read_req);
    unaff_RBX = (undefined1 *)local_348._0_8_;
    pcStack_370 = (code *)0x157da9;
    puVar11 = (undefined1 *)local_348._0_8_;
    iVar2 = bcmp((void *)local_348._0_8_,(void *)local_338._0_8_,0x80);
    iVar3 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00157e33;
    unaff_RBX = unaff_RBX + 0x80;
    pcStack_370 = (code *)0x157dc7;
    puVar11 = unaff_RBX;
    iVar2 = bcmp(unaff_RBX,(void *)local_328._0_8_,0x3e);
    iVar3 = (int)puVar11;
    if (iVar2 != 0) goto LAB_00157e38;
    iVar3 = 0;
    pcStack_370 = (code *)0x157de1;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00157e3d;
    if (close_req.result == 0) {
      pcStack_370 = (code *)0x157dfb;
      uv_fs_req_cleanup(&close_req);
      return;
    }
  }
  pcStack_370 = run_test_fs_read_file_eof;
  fs_read_bufs_cold_13();
  pcStack_378 = (code *)0x157e4d;
  pcStack_370 = (code *)unaff_RBX;
  fs_read_file_eof(iVar3);
  pcStack_378 = (code *)0x157e52;
  fs_read_file_eof(iVar3);
  pcStack_378 = (code *)0x157e57;
  uVar4 = uv_default_loop();
  pcStack_378 = (code *)0x157e6b;
  uv_walk(uVar4,close_walk_cb,0);
  pcStack_378 = (code *)0x157e75;
  uv_run(uVar4,0);
  pcStack_378 = (code *)0x157e7a;
  uVar5 = uv_default_loop();
  pcStack_378 = (code *)0x157e82;
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  pcStack_378 = fs_read_file_eof;
  run_test_fs_read_file_eof_cold_1();
  puVar10 = (uv_fs_t *)0x184395;
  puStack_390 = (uv_fs_t *)0x157ea3;
  pcStack_378 = (code *)uVar4;
  unlink("test_file");
  puStack_390 = (uv_fs_t *)0x157ea8;
  loop = (uv_loop_t *)uv_default_loop();
  iVar3 = 0;
  puStack_390 = (uv_fs_t *)0x157ece;
  iVar2 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar2 < 0) {
    puStack_390 = (uv_fs_t *)0x15812b;
    fs_read_file_eof_cold_1();
LAB_0015812b:
    puStack_390 = (uv_fs_t *)0x158130;
    fs_read_file_eof_cold_2();
LAB_00158130:
    puStack_390 = (uv_fs_t *)0x158135;
    fs_read_file_eof_cold_3();
LAB_00158135:
    puStack_390 = (uv_fs_t *)0x15813a;
    fs_read_file_eof_cold_4();
LAB_0015813a:
    puStack_390 = (uv_fs_t *)0x15813f;
    fs_read_file_eof_cold_5();
LAB_0015813f:
    puStack_390 = (uv_fs_t *)0x158144;
    fs_read_file_eof_cold_6();
LAB_00158144:
    puStack_390 = (uv_fs_t *)0x158149;
    fs_read_file_eof_cold_7();
LAB_00158149:
    puStack_390 = (uv_fs_t *)0x15814e;
    fs_read_file_eof_cold_8();
LAB_0015814e:
    puStack_390 = (uv_fs_t *)0x158153;
    fs_read_file_eof_cold_9();
LAB_00158153:
    puStack_390 = (uv_fs_t *)0x158158;
    fs_read_file_eof_cold_10();
LAB_00158158:
    puStack_390 = (uv_fs_t *)0x15815d;
    fs_read_file_eof_cold_11();
LAB_0015815d:
    puStack_390 = (uv_fs_t *)0x158162;
    fs_read_file_eof_cold_12();
LAB_00158162:
    puStack_390 = (uv_fs_t *)0x158167;
    fs_read_file_eof_cold_13();
LAB_00158167:
    puStack_390 = (uv_fs_t *)0x15816c;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015812b;
    puStack_390 = (uv_fs_t *)0x157ef0;
    uv_fs_req_cleanup(&open_req1);
    puStack_390 = (uv_fs_t *)0x157f01;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x157f3f;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_00158130;
    if (write_req.result < 0) goto LAB_00158135;
    puStack_390 = (uv_fs_t *)0x157f61;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x157f77;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_0015813a;
    if (close_req.result != 0) goto LAB_0015813f;
    puStack_390 = (uv_fs_t *)0x157f99;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x157fb6;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar2 < 0) goto LAB_00158144;
    if (open_req1.result._4_4_ < 0) goto LAB_00158149;
    puStack_390 = (uv_fs_t *)0x157fd8;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_390 = (uv_fs_t *)0x157ffa;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x158038;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 < 0) goto LAB_0015814e;
    if (read_req.result < 0) goto LAB_00158153;
    iVar3 = 0x2e3070;
    puStack_390 = (uv_fs_t *)0x158061;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00158158;
    puVar10 = &read_req;
    puStack_390 = (uv_fs_t *)0x158078;
    uv_fs_req_cleanup(&read_req);
    puStack_390 = (uv_fs_t *)0x158089;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_388 = 0;
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x1580c3;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,read_req.result);
    if (iVar2 != 0) goto LAB_0015815d;
    if (read_req.result != 0) goto LAB_00158162;
    puStack_390 = (uv_fs_t *)0x1580e5;
    uv_fs_req_cleanup();
    iVar3 = 0;
    puStack_390 = (uv_fs_t *)0x1580fb;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158167;
    if (close_req.result == 0) {
      puStack_390 = (uv_fs_t *)0x158115;
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      return;
    }
  }
  puStack_390 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_398 = (uv_fs_t *)0x158177;
  puStack_390 = puVar10;
  fs_write_multiple_bufs(iVar3);
  puStack_398 = (uv_fs_t *)0x15817c;
  fs_write_multiple_bufs(iVar3);
  puStack_398 = (uv_fs_t *)0x158181;
  uVar4 = uv_default_loop();
  puStack_398 = (uv_fs_t *)0x158195;
  uv_walk(uVar4,close_walk_cb,0);
  puStack_398 = (uv_fs_t *)0x15819f;
  uv_run(uVar4,0);
  puStack_398 = (uv_fs_t *)0x1581a4;
  uVar5 = uv_default_loop();
  puStack_398 = (uv_fs_t *)0x1581ac;
  iVar2 = uv_loop_close(uVar5);
  if (iVar2 == 0) {
    return;
  }
  puStack_398 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  uStack_3a0 = uVar4;
  puStack_398 = unaff_R14;
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0;
  iVar3 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  if (iVar3 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_0015864c:
    fs_write_multiple_bufs_cold_2();
LAB_00158651:
    fs_write_multiple_bufs_cold_3();
LAB_00158656:
    fs_write_multiple_bufs_cold_4();
LAB_0015865b:
    fs_write_multiple_bufs_cold_5();
LAB_00158660:
    fs_write_multiple_bufs_cold_6();
LAB_00158665:
    fs_write_multiple_bufs_cold_7();
LAB_0015866a:
    fs_write_multiple_bufs_cold_8();
LAB_0015866f:
    fs_write_multiple_bufs_cold_9();
LAB_00158674:
    fs_write_multiple_bufs_cold_10();
LAB_00158679:
    fs_write_multiple_bufs_cold_11();
LAB_0015867e:
    fs_write_multiple_bufs_cold_12();
LAB_00158683:
    fs_write_multiple_bufs_cold_13();
LAB_00158688:
    fs_write_multiple_bufs_cold_14();
LAB_0015868d:
    fs_write_multiple_bufs_cold_15();
LAB_00158692:
    fs_write_multiple_bufs_cold_16();
LAB_00158697:
    fs_write_multiple_bufs_cold_19();
LAB_0015869c:
    fs_write_multiple_bufs_cold_20();
LAB_001586a1:
    fs_write_multiple_bufs_cold_21();
LAB_001586a6:
    fs_write_multiple_bufs_cold_22();
LAB_001586ab:
    fs_write_multiple_bufs_cold_23();
LAB_001586b0:
    fs_write_multiple_bufs_cold_24();
LAB_001586b5:
    fs_write_multiple_bufs_cold_25();
LAB_001586ba:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_0015864c;
    uv_fs_req_cleanup(&open_req1);
    auStack_3c8 = uv_buf_init(test_buf,0xd);
    auStack_3b8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,auStack_3c8,2,0);
    if (iVar3 < 0) goto LAB_00158651;
    if (write_req.result < 0) goto LAB_00158656;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_0015865b;
    if (close_req.result != 0) goto LAB_00158660;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00158665;
    if (open_req1.result._4_4_ < 0) goto LAB_0015866a;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    auVar17 = uv_buf_init(buf,0xd);
    auStack_3c8 = auVar17;
    auVar17 = uv_buf_init(buf2);
    iVar2 = (int)open_req1.result;
    auStack_3b8 = auVar17;
    _Var6 = lseek64((int)open_req1.result,0,1);
    if (_Var6 != 0) goto LAB_0015866f;
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3c8,2,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158674;
    if (read_req.result != 0x1c) goto LAB_00158679;
    iVar2 = 0x2e3070;
    iVar3 = strcmp(buf,test_buf);
    if (iVar3 != 0) goto LAB_0015867e;
    iVar2 = 0x2e4460;
    iVar3 = strcmp(buf2,test_buf2);
    if (iVar3 != 0) goto LAB_00158683;
    uv_fs_req_cleanup(&read_req);
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar16;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00158688;
    if (read_req.result != 0) goto LAB_0015868d;
    uv_fs_req_cleanup(&read_req);
    auVar17 = uv_buf_init(buf,0xd);
    auStack_3c8 = auVar17;
    auVar17 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    auStack_3b8 = auVar17;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3c8,2,0);
    if (iVar3 < 0) goto LAB_00158692;
    if (read_req.result == 0x1c) {
LAB_0015854a:
      iVar2 = 0x2e3070;
      iVar3 = strcmp(buf,test_buf);
      if (iVar3 != 0) goto LAB_00158697;
      iVar2 = 0x2e4460;
      iVar3 = strcmp(buf2,test_buf2);
      if (iVar3 != 0) goto LAB_0015869c;
      uv_fs_req_cleanup(&read_req);
      uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar16;
      iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0x1c);
      if (iVar3 != 0) goto LAB_001586a1;
      if (read_req.result != 0) goto LAB_001586a6;
      uv_fs_req_cleanup();
      iVar2 = 0;
      iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
      if (iVar3 != 0) goto LAB_001586ab;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        unlink("test_file");
        return;
      }
      goto LAB_001586b0;
    }
    if (read_req.result != 0xd) goto LAB_001586b5;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,auStack_3b8,1,read_req.result);
    if (iVar3 < 0) goto LAB_001586ba;
    if (read_req.result == 0xf) goto LAB_0015854a;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  uVar4 = uv_default_loop();
  uv_walk(uVar4,close_walk_cb,0);
  uv_run(uVar4,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar2 = 0xd4310;
  pvVar7 = malloc(0xd4310);
  if (pvVar7 == (void *)0x0) {
LAB_00158a3c:
    fs_write_alotof_bufs_cold_18();
LAB_00158a41:
    fs_write_alotof_bufs_cold_1();
LAB_00158a46:
    fs_write_alotof_bufs_cold_2();
LAB_00158a4b:
    fs_write_alotof_bufs_cold_3();
LAB_00158a50:
    fs_write_alotof_bufs_cold_4();
LAB_00158a55:
    fs_write_alotof_bufs_cold_17();
LAB_00158a5a:
    fs_write_alotof_bufs_cold_5();
LAB_00158a5f:
    fs_write_alotof_bufs_cold_6();
LAB_00158a64:
    fs_write_alotof_bufs_cold_7();
LAB_00158a69:
    fs_write_alotof_bufs_cold_8();
LAB_00158a6e:
    fs_write_alotof_bufs_cold_9();
LAB_00158a73:
    fs_write_alotof_bufs_cold_10();
LAB_00158a78:
    fs_write_alotof_bufs_cold_12();
LAB_00158a7d:
    fs_write_alotof_bufs_cold_13();
LAB_00158a82:
    fs_write_alotof_bufs_cold_14();
LAB_00158a87:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar3 < 0) goto LAB_00158a41;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a46;
    uv_fs_req_cleanup(&open_req1);
    lVar13 = 8;
    do {
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar7 + lVar13 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar7 + lVar13) = auVar17._8_8_;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158a4b;
    if (write_req.result != 0xac67d) goto LAB_00158a50;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pvVar8 = malloc(0xac67d);
    if (pvVar8 == (void *)0x0) goto LAB_00158a55;
    lVar13 = 8;
    pvVar14 = pvVar8;
    do {
      auVar17 = uv_buf_init(pvVar14,0xd);
      *(long *)((long)pvVar7 + lVar13 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar7 + lVar13) = auVar17._8_8_;
      lVar13 = lVar13 + 0x10;
      pvVar14 = (void *)((long)pvVar14 + 0xd);
    } while (lVar13 != 0xd4318);
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    unaff_R12 = 0xd4318;
    if (iVar3 != 0) goto LAB_00158a5a;
    if (close_req.result != 0) goto LAB_00158a5f;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_open(0,&open_req1,"test_file",0,0,0);
    if (iVar3 < 0) goto LAB_00158a64;
    if (open_req1.result._4_4_ < 0) goto LAB_00158a69;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar7,0xd431,0xffffffffffffffff);
    if (iVar3 < 0) goto LAB_00158a6e;
    if (read_req.result != 0x3400) goto LAB_00158a73;
    unaff_R12 = 0;
    do {
      pcVar9 = (char *)((long)pvVar8 + unaff_R12);
      iVar3 = strncmp(pcVar9,test_buf,0xd);
      iVar2 = (int)pcVar9;
      if (iVar3 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00158a3c;
      }
      unaff_R12 = unaff_R12 + 0xd;
    } while (unaff_R12 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pvVar8);
    iVar2 = (int)open_req1.result;
    _Var6 = lseek64((int)open_req1.result,write_req.result,0);
    if (_Var6 != write_req.result) goto LAB_00158a78;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar16;
    iVar3 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar3 != 0) goto LAB_00158a7d;
    if (read_req.result != 0) goto LAB_00158a82;
    uv_fs_req_cleanup();
    iVar2 = 0;
    iVar3 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar3 != 0) goto LAB_00158a87;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(pvVar7);
      return;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  pvVar7 = (void *)uv_default_loop();
  uv_walk(pvVar7,close_walk_cb,0);
  uv_run(pvVar7,0);
  uVar4 = uv_default_loop();
  iVar2 = uv_loop_close(uVar4);
  if (iVar2 == 0) {
    return;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  pcStack_450 = (code *)0x158af0;
  uStack_448 = extraout_RAX;
  pvStack_440 = pvVar7;
  lStack_438 = unaff_R12;
  unlink("test_file");
  pcStack_450 = (code *)0x158af5;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_450 = (code *)0x158b06;
  pvVar8 = malloc(0xd4310);
  if (pvVar8 == (void *)0x0) {
LAB_00158e4b:
    pvVar8 = pvVar7;
    pcStack_450 = (code *)0x158e50;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00158e50:
    pcStack_450 = (code *)0x158e55;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00158e55:
    pcStack_450 = (code *)0x158e5a;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_00158e5a:
    pcStack_450 = (code *)0x158e5f;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00158e5f:
    pcStack_450 = (code *)0x158e64;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00158e64:
    pcStack_450 = (code *)0x158e69;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_00158e69:
    pcStack_450 = (code *)0x158e6e;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00158e6e:
    pcStack_450 = (code *)0x158e73;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00158e73:
    pcStack_450 = (code *)0x158e78;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_00158e78:
    pcStack_450 = (code *)0x158e7d;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00158e7d:
    pcStack_450 = (code *)0x158e82;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00158e82:
    pcStack_450 = (code *)0x158e87;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_00158e87:
    pcStack_450 = (code *)0x158e8c;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00158e8c:
    pcStack_450 = (code *)0x158e91;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00158e91:
    pcStack_450 = (code *)0x158e96;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    pcStack_450 = (code *)0x158b35;
    iVar2 = uv_fs_open(0,&open_req1,"test_file",0x42,0x180,0);
    if (iVar2 < 0) goto LAB_00158e50;
    if (open_req1.result._4_4_ < 0) goto LAB_00158e55;
    pcStack_450 = (code *)0x158b57;
    uv_fs_req_cleanup(&open_req1);
    pcStack_450 = (code *)0x158b68;
    uVar16 = (uv_buf_t)uv_buf_init("0123456789",10);
    uStack_448 = 0;
    pcStack_450 = (code *)0x158ba6;
    iov = uVar16;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,&iov,1,0xffffffffffffffff);
    if (iVar2 != 10) goto LAB_00158e5a;
    if (write_req.result != 10) goto LAB_00158e5f;
    pcStack_450 = (code *)0x158bc9;
    uv_fs_req_cleanup(&write_req);
    lVar13 = 8;
    do {
      pcStack_450 = (code *)0x158be3;
      auVar17 = uv_buf_init(test_buf,0xd);
      *(long *)((long)pvVar8 + lVar13 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar13) = auVar17._8_8_;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0xd4318);
    uStack_448 = 0;
    pcStack_450 = (code *)0x158c24;
    iVar2 = uv_fs_write(0,&write_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e64;
    if (write_req.result != 0xac67d) goto LAB_00158e69;
    pcStack_450 = (code *)0x158c49;
    uv_fs_req_cleanup(&write_req);
    pcStack_450 = (code *)0x158c53;
    pcVar9 = (char *)malloc(0xac67d);
    if (pcVar9 == (char *)0x0) goto LAB_00158e6e;
    lVar13 = 8;
    pcVar15 = pcVar9;
    do {
      pcStack_450 = (code *)0x158c75;
      auVar17 = uv_buf_init(pcVar15,0xd);
      *(long *)((long)pvVar8 + lVar13 + -8) = auVar17._0_8_;
      *(long *)((long)pvVar8 + lVar13) = auVar17._8_8_;
      lVar13 = lVar13 + 0x10;
      pcVar15 = pcVar15 + 0xd;
    } while (lVar13 != 0xd4318);
    uStack_448 = 0;
    pcStack_450 = (code *)0x158cba;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,pvVar8,0xd431,10);
    if (iVar2 < 0) goto LAB_00158e73;
    lVar13 = 0xd;
    if (iVar2 != 0xd) {
      lVar13 = 0x3400;
    }
    if (read_req.result != lVar13) goto LAB_00158e78;
    pcVar15 = pcVar9;
    uVar12 = 0;
    do {
      pcStack_450 = (code *)0x158cff;
      iVar3 = strncmp(pcVar15,test_buf,0xd);
      if (iVar3 != 0) {
        pcStack_450 = (code *)0x158e4b;
        fs_write_alotof_bufs_with_offset_cold_9();
        pvVar7 = pvVar8;
        goto LAB_00158e4b;
      }
      if (iVar2 == 0xd) break;
      pcVar15 = pcVar15 + 0xd;
      bVar1 = uVar12 < 0x3ff;
      uVar12 = uVar12 + 1;
    } while (bVar1);
    pcStack_450 = (code *)0x158d2c;
    uv_fs_req_cleanup(&read_req);
    pcStack_450 = (code *)0x158d34;
    free(pcVar9);
    pcStack_450 = (code *)0x158d4b;
    iVar2 = uv_fs_stat(0,&stat_req,"test_file",0);
    if (iVar2 != 0) goto LAB_00158e7d;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00158e82;
    pcStack_450 = (code *)0x158d7b;
    uv_fs_req_cleanup(&stat_req);
    pcStack_450 = (code *)0x158d8c;
    uVar16 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_448 = 0;
    pcStack_450 = (code *)0x158dce;
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,write_req.result + 10);
    if (iVar2 != 0) goto LAB_00158e87;
    if (read_req.result != 0) goto LAB_00158e8c;
    pcStack_450 = (code *)0x158df0;
    uv_fs_req_cleanup(&read_req);
    pcStack_450 = (code *)0x158e06;
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 != 0) goto LAB_00158e91;
    if (close_req.result == 0) {
      pcStack_450 = (code *)0x158e24;
      uv_fs_req_cleanup(&close_req);
      pcStack_450 = (code *)0x158e30;
      unlink("test_file");
      free(pvVar8);
      return;
    }
  }
  pcStack_450 = run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  pcStack_450 = (code *)pvVar8;
  loop = (uv_loop_t *)uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,0);
    if (mkdir_cb_count != 1) goto LAB_0015900d;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,0);
    if (iVar2 < 0) goto LAB_00159012;
    uv_fs_req_cleanup(&open_req1);
    uVar16 = (uv_buf_t)uv_buf_init(auStack_452,2);
    iov = uVar16;
    iVar2 = uv_fs_read(0,&read_req,(int)open_req1.result,&iov,1,0,0);
    if (iVar2 != -0x15) goto LAB_00159017;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close(0,&close_req,(int)open_req1.result,0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      uVar4 = uv_default_loop();
      iVar2 = uv_loop_close(uVar4);
      if (iVar2 == 0) {
        return;
      }
      goto LAB_00159021;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_0015900d:
    run_test_fs_read_dir_cold_2();
LAB_00159012:
    run_test_fs_read_dir_cold_3();
LAB_00159017:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_00159021:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return;
}

Assistant:

static void fs_read_bufs(int add_flags) {
  char scratch[768];
  uv_buf_t bufs[4];

  ASSERT(0 <= uv_fs_open(NULL, &open_req1,
                         "test/fixtures/lorem_ipsum.txt",
                         O_RDONLY | add_flags, 0, NULL));
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 0, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 NULL, 1, 0, NULL));
  ASSERT(UV_EINVAL == uv_fs_read(NULL, &read_req, open_req1.result,
                                 bufs, 0, 0, NULL));

  bufs[0] = uv_buf_init(scratch + 0, 256);
  bufs[1] = uv_buf_init(scratch + 256, 256);
  bufs[2] = uv_buf_init(scratch + 512, 128);
  bufs[3] = uv_buf_init(scratch + 640, 128);

  ASSERT(446 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 0,
                           2,  /* 2x 256 bytes. */
                           0,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == 446);
  uv_fs_req_cleanup(&read_req);

  ASSERT(190 == uv_fs_read(NULL,
                           &read_req,
                           open_req1.result,
                           bufs + 2,
                           2,  /* 2x 128 bytes. */
                           256,  /* Positional read. */
                           NULL));
  ASSERT(read_req.result == /* 446 - 256 */ 190);
  uv_fs_req_cleanup(&read_req);

  ASSERT(0 == memcmp(bufs[1].base + 0, bufs[2].base, 128));
  ASSERT(0 == memcmp(bufs[1].base + 128, bufs[3].base, 190 - 128));

  ASSERT(0 == uv_fs_close(NULL, &close_req, open_req1.result, NULL));
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);
}